

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O3

curl_socket_t Curl_conn_get_socket(Curl_easy *data,int sockindex)

{
  connectdata *pcVar1;
  Curl_cfilter *pCVar2;
  CURLcode CVar3;
  undefined8 in_RAX;
  curl_socket_t sock;
  uint local_14;
  
  local_14 = (uint)((ulong)in_RAX >> 0x20);
  pcVar1 = data->conn;
  if (pcVar1 == (connectdata *)0x0) {
    local_14 = 0xffffffff;
  }
  else {
    pCVar2 = pcVar1->cfilter[sockindex];
    if ((pCVar2 == (Curl_cfilter *)0x0) || ((pCVar2->field_0x24 & 1) != 0)) {
      local_14 = pcVar1->sock[sockindex];
    }
    else {
      CVar3 = (*pCVar2->cft->query)(pCVar2,data,3,(int *)0x0,&local_14);
      local_14 = -(uint)(CVar3 != CURLE_OK) | local_14;
    }
  }
  return local_14;
}

Assistant:

curl_socket_t Curl_conn_get_socket(struct Curl_easy *data, int sockindex)
{
  struct Curl_cfilter *cf;

  cf = data->conn ? data->conn->cfilter[sockindex] : NULL;
  /* if the top filter has not connected, ask it (and its sub-filters)
   * for the socket. Otherwise conn->sock[sockindex] should have it.
   */
  if(cf && !cf->connected)
    return Curl_conn_cf_get_socket(cf, data);
  return data->conn ? data->conn->sock[sockindex] : CURL_SOCKET_BAD;
}